

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

string * __thiscall
libcellml::nodesCellMl1XVersion_abi_cxx11_
          (string *__return_storage_ptr__,libcellml *this,XmlNodePtr *node)

{
  bool bVar1;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_a;
  allocator<char> local_9;
  
  bVar1 = XmlNode::isCellml10Element(*(XmlNode **)this,(char *)0x0);
  if (bVar1) {
    __s = "1.0";
    __a = &local_9;
  }
  else {
    __s = "1.1";
    __a = &local_a;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string nodesCellMl1XVersion(const XmlNodePtr &node)
{
    if (node->isCellml10Element()) {
        return "1.0";
    }

    return "1.1";
}